

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O1

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined2 *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined2 *puVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  size_t local_58;
  
  iVar16 = 1 << ((byte)tableLog & 0x1f);
  uVar8 = tableLog - 5;
  puVar5 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar7 = 4;
  bVar17 = false;
  uVar12 = 0;
  puVar9 = (undefined2 *)header;
  iVar10 = tableLog + 1;
  uVar2 = iVar16 + 1;
  do {
    if (bVar17) {
      uVar13 = (ulong)(uVar12 - 1);
      do {
        uVar11 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar11;
      } while (normalizedCounter[uVar13] == 0);
      if (uVar12 + 0x18 <= uVar11) {
        uVar3 = uVar12;
        do {
          uVar8 = uVar8 + (0xffff << ((byte)iVar7 & 0x1f));
          if ((writeIsSafe == 0) && (puVar5 < puVar9)) {
            bVar17 = false;
            local_58 = 0xffffffffffffffba;
            goto LAB_00177594;
          }
          *puVar9 = (short)uVar8;
          puVar9 = puVar9 + 1;
          uVar8 = uVar8 >> 0x10;
          uVar12 = uVar3 + 0x18;
          uVar14 = uVar3 + 0x30;
          uVar3 = uVar12;
        } while (uVar14 <= uVar11);
      }
      uVar3 = uVar12 + 3;
      iVar6 = iVar7;
      while (uVar3 <= uVar11) {
        uVar8 = uVar8 + (3 << ((byte)iVar6 & 0x1f));
        iVar6 = iVar6 + 2;
        uVar3 = uVar12 + 6;
        uVar12 = uVar12 + 3;
      }
      uVar8 = (uVar11 - uVar12 << ((byte)iVar6 & 0x1f)) + uVar8;
      iVar7 = iVar6 + 2;
      bVar17 = true;
      if (0xe < iVar6) {
        if ((writeIsSafe == 0) && (puVar5 < puVar9)) {
          bVar17 = false;
          local_58 = 0xffffffffffffffba;
        }
        else {
          *puVar9 = (short)uVar8;
          puVar9 = puVar9 + 1;
          uVar8 = uVar8 >> 0x10;
          iVar7 = iVar6 + -0xe;
          bVar17 = true;
        }
      }
LAB_00177594:
      if (!bVar17) {
        return local_58;
      }
    }
    else {
      uVar13 = (ulong)uVar12;
    }
    iVar4 = (int)normalizedCounter[uVar13];
    iVar6 = -iVar4;
    if (0 < iVar4) {
      iVar6 = iVar4;
    }
    iVar1 = ~uVar2 + iVar16 * 2;
    iVar15 = iVar1;
    if (iVar4 + 1 < iVar16) {
      iVar15 = 0;
    }
    iVar15 = iVar15 + iVar4 + 1;
    bVar17 = iVar15 == 1;
    uVar11 = uVar2 - iVar6;
    iVar4 = iVar10;
    if (uVar11 == 0 || (int)uVar2 < iVar6) {
      local_58 = 0xffffffffffffffff;
    }
    else {
      for (; (int)uVar11 < iVar16; iVar16 = iVar16 >> 1) {
        iVar4 = iVar4 + -1;
      }
    }
    if ((int)uVar11 < 1) {
      return local_58;
    }
    uVar8 = uVar8 + (iVar15 << ((byte)iVar7 & 0x1f));
    iVar7 = (iVar7 + iVar10) - (uint)(iVar15 < iVar1);
    if (0x10 < iVar7) {
      if ((writeIsSafe == 0) && (puVar5 < puVar9)) {
        return 0xffffffffffffffba;
      }
      *puVar9 = (short)uVar8;
      puVar9 = puVar9 + 1;
      uVar8 = uVar8 >> 0x10;
      iVar7 = iVar7 + -0x10;
    }
    uVar12 = (int)uVar13 + 1;
    iVar10 = iVar4;
    uVar2 = uVar11;
    if (uVar11 == 1) {
      if ((writeIsSafe != 0) ||
         (local_58 = 0xffffffffffffffba,
         puVar9 <= (undefined2 *)((long)header + (headerBufferSize - 2)))) {
        *puVar9 = (short)uVar8;
        local_58 = 0xffffffffffffffff;
        if (uVar12 <= maxSymbolValue + 1) {
          iVar16 = iVar7 + 0xe;
          if (-1 < iVar7 + 7) {
            iVar16 = iVar7 + 7;
          }
          local_58 = (long)puVar9 + ((long)(iVar16 >> 3) - (long)header);
        }
      }
      return local_58;
    }
  } while( true );
}

Assistant:

static size_t FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                                       const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                                       unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    bitStream = 0;
    bitCount  = 0;
    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while (remaining>1) {  /* stops at 1 */
        if (previous0) {
            unsigned start = charnum;
            while (!normalizedCounter[charnum]) charnum++;
            while (charnum >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (charnum >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (charnum-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[charnum++];
            int const max = (2*threshold-1)-remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold) count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previous0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2)) return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    if (charnum > maxSymbolValue + 1) return ERROR(GENERIC);

    return (out-ostart);
}